

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermNode * __thiscall
glslang::HlslParseContext::handleReturnValue
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *value)

{
  TType *pTVar1;
  bool bVar2;
  int iVar3;
  TIntermBranch *pTVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  HlslParseContext *local_28;
  TIntermTyped *value_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  (this->super_TParseContextBase).functionReturnsValue = true;
  iVar3 = (*((this->super_TParseContextBase).currentFunctionType)->_vptr_TType[7])();
  if (iVar3 == 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"void function cannot return a value","return","");
    pTVar4 = TIntermediate::addBranch
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,EOpReturn,
                        loc);
    return &pTVar4->super_TIntermNode;
  }
  pTVar1 = (this->super_TParseContextBase).currentFunctionType;
  iVar3 = (*(value->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  bVar2 = TType::operator!=(pTVar1,(TType *)CONCAT44(extraout_var,iVar3));
  local_28 = (HlslParseContext *)value;
  if (bVar2) {
    local_28 = (HlslParseContext *)
               TIntermediate::addConversion
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                          EOpReturn,(this->super_TParseContextBase).currentFunctionType,value);
    if (local_28 != (HlslParseContext *)0x0) {
      pTVar1 = (this->super_TParseContextBase).currentFunctionType;
      iVar3 = (*(local_28->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1e])
                        ();
      bVar2 = TType::operator!=(pTVar1,(TType *)CONCAT44(extraout_var_00,iVar3));
      if (bVar2) {
        local_28 = (HlslParseContext *)
                   TIntermediate::addUniShapeConversion
                             ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                              EOpReturn,(this->super_TParseContextBase).currentFunctionType,
                              (TIntermTyped *)local_28);
      }
    }
    if (local_28 != (HlslParseContext *)0x0) {
      pTVar1 = (this->super_TParseContextBase).currentFunctionType;
      iVar3 = (*(local_28->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1e])
                        ();
      bVar2 = TType::operator!=(pTVar1,(TType *)CONCAT44(extraout_var_01,iVar3));
      if (!bVar2) goto LAB_0056604f;
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"type does not match, or is not convertible to, the function\'s return type"
               ,"return","");
    this_local = local_28;
  }
  else {
LAB_0056604f:
    this_local = (HlslParseContext *)
                 TIntermediate::addBranch
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                            EOpReturn,(TIntermTyped *)local_28,loc);
  }
  return (TIntermNode *)this_local;
}

Assistant:

TIntermNode* HlslParseContext::handleReturnValue(const TSourceLoc& loc, TIntermTyped* value)
{
    functionReturnsValue = true;

    if (currentFunctionType->getBasicType() == EbtVoid) {
        error(loc, "void function cannot return a value", "return", "");
        return intermediate.addBranch(EOpReturn, loc);
    } else if (*currentFunctionType != value->getType()) {
        value = intermediate.addConversion(EOpReturn, *currentFunctionType, value);
        if (value && *currentFunctionType != value->getType())
            value = intermediate.addUniShapeConversion(EOpReturn, *currentFunctionType, value);
        if (value == nullptr || *currentFunctionType != value->getType()) {
            error(loc, "type does not match, or is not convertible to, the function's return type", "return", "");
            return value;
        }
    }

    return intermediate.addBranch(EOpReturn, value, loc);
}